

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t * archive_acl_text_w(archive *a,archive_acl *acl,wchar_t flags)

{
  archive_acl *paVar1;
  wchar_t wVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  archive_acl_entry *paVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  archive_acl_entry *paVar10;
  wchar_t *wp;
  wchar_t *wname;
  archive_acl *local_40;
  archive *local_38;
  
  if (acl->acl_text_w != (wchar_t *)0x0) {
    free(acl->acl_text_w);
    acl->acl_text_w = (wchar_t *)0x0;
  }
  paVar6 = (archive_acl_entry *)&acl->acl_head;
  iVar9 = 0;
  lVar8 = 0;
  paVar10 = paVar6;
  local_40 = acl;
  while (paVar10 = paVar10->next, paVar10 != (archive_acl_entry *)0x0) {
    if ((paVar10->type & flags) != 0) {
      lVar7 = lVar8 + 8;
      if (((uint)paVar10->type >> 9 & 1) == 0) {
        lVar7 = lVar8;
      }
      if (((uint)flags >> 0xb & 1) == 0) {
        lVar7 = lVar8;
      }
      local_38 = a;
      wVar2 = archive_mstring_get_wcs(a,&paVar10->name,&wname);
      if (wname == (wchar_t *)0x0 || wVar2 != L'\0') {
        if ((wVar2 < L'\0') && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
          return (wchar_t *)0x0;
        }
        lVar8 = lVar7 + 0x13;
      }
      else {
        sVar3 = wcslen(wname);
        lVar8 = lVar7 + sVar3 + 6;
      }
      iVar9 = iVar9 + 1;
      lVar8 = lVar8 + 0x13;
      a = local_38;
    }
  }
  if (iVar9 != 0) {
    sVar3 = lVar8 * 4 + 0x80;
    if (((uint)flags >> 8 & 1) == 0) {
      sVar3 = lVar8 * 4;
    }
    wp = (wchar_t *)malloc(sVar3);
    paVar1 = local_40;
    local_40->acl_text_w = wp;
    if (wp != (wchar_t *)0x0) {
      if (((uint)flags >> 8 & 1) == 0) {
LAB_00199aa1:
        if (((uint)flags >> 9 & 1) == 0) {
LAB_00199aab:
          return local_40->acl_text_w;
        }
        piVar4 = (wchar_t *)0x0;
        if (((uint)flags >> 0xb & 1) != 0) {
          piVar4 = anon_var_dwarf_fada3;
        }
        iVar9 = 0;
        do {
          while( true ) {
            do {
              paVar6 = paVar6->next;
              if (paVar6 == (archive_acl_entry *)0x0) goto LAB_00199aab;
            } while ((paVar6->type & L'Ȁ') == L'\0');
            wVar2 = archive_mstring_get_wcs(a,&paVar6->name,&wname);
            if (wVar2 != L'\0') break;
            if (iVar9 != 0) {
              *wp = L',';
              wp = wp + 1;
            }
            wVar2 = L'\xffffffff';
            if (((uint)flags >> 10 & 1) != 0) {
              wVar2 = paVar6->id;
            }
            append_entry_w(&wp,piVar4,paVar6->tag,wname,paVar6->permset,wVar2);
            iVar9 = iVar9 + 1;
          }
        } while ((L'\xffffffff' < wVar2) || (piVar5 = __errno_location(), *piVar5 != 0xc));
      }
      else {
        append_entry_w(&wp,(wchar_t *)0x0,L'✒',(wchar_t *)0x0,local_40->mode & 0x1c0,L'\xffffffff'
                      );
        *wp = L',';
        wp = wp + 1;
        append_entry_w(&wp,(wchar_t *)0x0,L'✔',(wchar_t *)0x0,paVar1->mode & 0x38,L'\xffffffff');
        *wp = L',';
        wp = wp + 1;
        append_entry_w(&wp,(wchar_t *)0x0,L'✖',(wchar_t *)0x0,paVar1->mode & 7,L'\xffffffff');
        paVar10 = paVar6;
        do {
          while( true ) {
            do {
              paVar10 = paVar10->next;
              if (paVar10 == (archive_acl_entry *)0x0) goto LAB_00199aa1;
            } while ((paVar10->type & L'Ā') == L'\0');
            wVar2 = archive_mstring_get_wcs(a,&paVar10->name,&wname);
            if (wVar2 != L'\0') break;
            *wp = L',';
            wVar2 = L'\xffffffff';
            if (((uint)flags >> 10 & 1) != 0) {
              wVar2 = paVar10->id;
            }
            wp = wp + 1;
            append_entry_w(&wp,(wchar_t *)0x0,paVar10->tag,wname,paVar10->permset,wVar2);
          }
        } while ((L'\xffffffff' < wVar2) || (piVar4 = __errno_location(), *piVar4 != 0xc));
      }
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t *
archive_acl_text_w(struct archive *a, struct archive_acl *acl, int flags)
{
	int count;
	size_t length;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r;
	wchar_t *wp;

	if (acl->acl_text_w != NULL) {
		free (acl->acl_text_w);
		acl->acl_text_w = NULL;
	}

	separator = L',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_wcs(a, &ap->name, &wname);
			if (r == 0 && wname != NULL)
				length += wcslen(wname);
			else if (r < 0 && errno == ENOMEM)
				return (NULL);
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (NULL);

	/* Now, allocate the string and actually populate it. */
	wp = acl->acl_text_w = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL)
		return (NULL);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		ap = acl->acl_head;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, NULL, ap->tag, wname,
					    ap->permset, id);
					count++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = L"default:";
		else
			prefix = NULL;
		ap = acl->acl_head;
		count = 0;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					if (count > 0)
						*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, prefix, ap->tag,
					    wname, ap->permset, id);
					count ++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}

	return (acl->acl_text_w);
}